

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O0

void __thiscall ODDLParser::DDLNode::attachParent(DDLNode *this,DDLNode *parent)

{
  DDLNode *local_20;
  DDLNode *local_18;
  DDLNode *parent_local;
  DDLNode *this_local;
  
  if ((this->m_parent != parent) && (this->m_parent = parent, this->m_parent != (DDLNode *)0x0)) {
    local_20 = this;
    local_18 = parent;
    parent_local = this;
    std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::push_back
              (&this->m_parent->m_children,&local_20);
  }
  return;
}

Assistant:

void DDLNode::attachParent( DDLNode *parent ) {
    if( m_parent == parent ) {
        return;
    }

    m_parent = parent;
    if( ddl_nullptr != m_parent ) {
        m_parent->m_children.push_back( this );
    }
}